

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktMemoryPipelineBarrierTests.cpp
# Opt level: O2

void __thiscall
vkt::memory::anon_unknown_0::ImageTransition::submit(ImageTransition *this,SubmitContext *context)

{
  DeviceInterface *pDVar1;
  undefined4 local_48 [2];
  undefined8 local_40;
  VkAccessFlags local_38;
  undefined8 local_34;
  VkImageLayout local_2c;
  undefined8 local_28;
  deUint64 local_20;
  undefined4 local_18;
  undefined4 uStack_14;
  undefined4 uStack_10;
  undefined4 uStack_c;
  undefined4 local_8;
  
  pDVar1 = context->m_context->m_context->m_vkd;
  local_48[0] = 0x2d;
  local_40 = 0;
  local_38 = this->m_srcAccesses;
  local_34._0_4_ = this->m_dstAccesses;
  local_34._4_4_ = this->m_srcLayout;
  local_2c = this->m_dstLayout;
  local_28 = 0xffffffffffffffff;
  local_20 = (context->m_context->m_currentImage).super_RefBase<vk::Handle<(vk::HandleType)9>_>.
             m_data.object.m_internal;
  local_18 = 1;
  uStack_14 = 0;
  uStack_10 = 1;
  uStack_c = 0;
  local_8 = 1;
  (*pDVar1->_vptr_DeviceInterface[0x6d])
            (pDVar1,context->m_commandBuffer,(ulong)this->m_srcStages,(ulong)this->m_dstStages,0,0,0
             ,0,0,1,local_48);
  return;
}

Assistant:

void ImageTransition::submit (SubmitContext& context)
{
	const vk::DeviceInterface&		vkd			= context.getContext().getDeviceInterface();
	const vk::VkCommandBuffer		cmd			= context.getCommandBuffer();
	const vk::VkImageMemoryBarrier	barrier		=
	{
		vk::VK_STRUCTURE_TYPE_IMAGE_MEMORY_BARRIER,
		DE_NULL,

		m_srcAccesses,
		m_dstAccesses,

		m_srcLayout,
		m_dstLayout,

		VK_QUEUE_FAMILY_IGNORED,
		VK_QUEUE_FAMILY_IGNORED,

		context.getImage(),
		{
			vk::VK_IMAGE_ASPECT_COLOR_BIT,
			0u, 1u,
			0u, 1u
		}
	};

	vkd.cmdPipelineBarrier(cmd, m_srcStages, m_dstStages, (vk::VkDependencyFlags)0, 0, (const vk::VkMemoryBarrier*)DE_NULL, 0, (const vk::VkBufferMemoryBarrier*)DE_NULL, 1, &barrier);
}